

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidStackWrongAxis(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *pNVar7;
  NeuralNetworkLayer *this;
  Tensor *pTVar8;
  StackLayerParams *pSVar9;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  undefined8 *puVar13;
  int iVar14;
  char *pcVar15;
  Model m;
  Result res;
  
  CoreML::Specification::Model::Model(&m);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input1",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input2",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"output",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,1);
  pNVar7 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  pTVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar8->rank_ = 3;
  pTVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar8->rank_ = 3;
  pSVar9 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_stack(this);
  pSVar9->axis_ = 4;
  CoreML::validate<(MLModelType)500>(&res,&m);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x14df);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar15 = "!((res).good())";
  }
  else {
    psVar11 = CoreML::Result::message_abi_cxx11_(&res);
    iVar14 = 0;
    lVar12 = std::__cxx11::string::find((char *)psVar11,0x2e2dc0);
    if (lVar12 != -1) goto LAB_00159d2f;
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x14e0);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar15 = "res.message().find(\"axis\") != std::string::npos";
  }
  poVar10 = std::operator<<(poVar10,pcVar15);
  poVar10 = std::operator<<(poVar10," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar14 = 1;
LAB_00159d2f:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar14;
}

Assistant:

int testInvalidStackWrongAxis() {

    Specification::Model m;

    auto *in1 = m.mutable_description()->add_input();
    in1->set_name("input1");
    auto *inShape1 = in1->mutable_type()->mutable_multiarraytype();
    inShape1->add_shape(3);
    inShape1->add_shape(5);
    inShape1->add_shape(2);

    auto *in2 = m.mutable_description()->add_input();
    in2->set_name("input2");
    auto *inShape2 = in2->mutable_type()->mutable_multiarraytype();
    inShape2->add_shape(3);
    inShape2->add_shape(5);
    inShape2->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_input("input2");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_stack();
    params->set_axis(4);

    // axis should be in range [-(rank + 1), rank + 1)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;

}